

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

ON_Quaternion *
ON_Quaternion::Slerp
          (ON_Quaternion *__return_storage_ptr__,ON_Quaternion q0,ON_Quaternion q1,double t)

{
  ON_Quaternion local_130;
  ON_Quaternion local_110;
  ON_Quaternion local_f0;
  ON_Quaternion local_d0;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  ON_Quaternion local_90;
  ON_Quaternion local_70;
  ON_Quaternion local_50;
  ON_Quaternion local_30;
  double local_10;
  double t_local;
  
  local_10 = t;
  ON_Quaternion(__return_storage_ptr__);
  if (0.5 < local_10) {
    Inverse(&local_f0,&q1);
    operator*(&local_d0,&local_f0,&q0);
    __return_storage_ptr__->a = local_d0.a;
    __return_storage_ptr__->b = local_d0.b;
    __return_storage_ptr__->c = local_d0.c;
    __return_storage_ptr__->d = local_d0.d;
    Pow(&local_130,*__return_storage_ptr__,1.0 - local_10);
    operator*(&local_110,&q1,&local_130);
    __return_storage_ptr__->a = local_110.a;
    __return_storage_ptr__->b = local_110.b;
    __return_storage_ptr__->c = local_110.c;
    __return_storage_ptr__->d = local_110.d;
  }
  else {
    Inverse(&local_50,&q0);
    operator*(&local_30,&local_50,&q1);
    __return_storage_ptr__->a = local_30.a;
    __return_storage_ptr__->b = local_30.b;
    __return_storage_ptr__->c = local_30.c;
    __return_storage_ptr__->d = local_30.d;
    local_b0 = __return_storage_ptr__->a;
    local_a8 = __return_storage_ptr__->b;
    local_a0 = __return_storage_ptr__->c;
    local_98 = __return_storage_ptr__->d;
    Pow(&local_90,*__return_storage_ptr__,local_10);
    operator*(&local_70,&q0,&local_90);
    __return_storage_ptr__->a = local_70.a;
    __return_storage_ptr__->b = local_70.b;
    __return_storage_ptr__->c = local_70.c;
    __return_storage_ptr__->d = local_70.d;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion ON_Quaternion::Slerp(ON_Quaternion q0, ON_Quaternion q1, double t)
{
  ON_Quaternion q;
  if ( t <= 0.5 )
  {
    q = q0.Inverse()*q1;
    q = q0*ON_Quaternion::Pow(q,t);
  }
  else
  {
    q = q1.Inverse()*q0;
    q = q1*ON_Quaternion::Pow(q,1.0-t);
  }
  return q;
}